

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::json(Config *this,string *parameter)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((parameter->_M_string_length != 0) && (bVar1 = std::operator==(parameter,"latest"), !bVar1)) {
    iVar2 = QUtil::string_to_int((parameter->_M_dataplus)._M_p);
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    json_version = iVar2;
    if (0xfffffffd < iVar2 - 3U) {
      return this;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"unsupported json version ",&local_59);
    std::operator+(&local_58,&local_38,parameter);
    usage(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    return this;
  }
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_version = 2;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::json(std::string const& parameter)
{
    if (parameter.empty() || (parameter == "latest")) {
        o.m->json_version = JSON::LATEST;
    } else {
        o.m->json_version = QUtil::string_to_int(parameter.c_str());
    }
    if ((o.m->json_version < 1) || (o.m->json_version > JSON::LATEST)) {
        usage(std::string("unsupported json version ") + parameter);
    }
    return this;
}